

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdata.c
# Opt level: O3

void * duckdb_je_hpdata_reserve_alloc(hpdata_t *hpdata,size_t sz)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  
  uVar16 = sz >> 0xc;
  uVar7 = 0;
  uVar4 = 0;
  uVar15 = 0;
  uVar11 = 0;
  do {
    uVar2 = uVar11 >> 6;
    uVar11 = (~hpdata->active_pages[uVar2] >> ((byte)uVar11 & 0x3f)) << ((byte)uVar11 & 0x3f);
    if (uVar11 == 0) {
      do {
        if (uVar2 == 7) goto LAB_01c535b2;
        lVar12 = uVar2 + 1;
        uVar2 = uVar2 + 1;
      } while (hpdata->active_pages[lVar12] == 0xffffffffffffffff);
      uVar11 = ~hpdata->active_pages[lVar12];
    }
    if (uVar2 << 6 < 0x200) {
      uVar7 = 0;
      if (uVar11 != 0) {
        for (; (uVar11 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
        }
      }
      uVar3 = uVar2 & 0x3ffffffffffffff;
      uVar11 = (hpdata->active_pages[uVar3] >> ((byte)uVar7 & 0x3f)) << ((byte)uVar7 & 0x3f);
      while (uVar11 == 0) {
        if (uVar3 == 7) {
          uVar4 = 0x200;
          goto LAB_01c535a6;
        }
        lVar12 = uVar3 + 1;
        uVar3 = uVar3 + 1;
        uVar11 = hpdata->active_pages[lVar12];
      }
      uVar4 = 0;
      if (uVar11 != 0) {
        for (; (uVar11 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar4 = uVar3 << 6 | uVar4;
LAB_01c535a6:
      uVar7 = uVar2 << 6 | uVar7;
      uVar4 = uVar4 - uVar7;
    }
LAB_01c535b2:
    if (uVar16 <= uVar4) break;
    if (uVar15 < uVar4) {
      uVar15 = uVar4;
    }
    uVar11 = uVar4 + uVar7;
  } while( true );
  uVar3 = uVar7 >> 6;
  uVar1 = (uint)uVar7 & 0x3f;
  uVar11 = uVar1 + uVar16;
  uVar2 = 0x40 - (ulong)uVar1;
  if (uVar11 < 0x41) {
    uVar2 = uVar16;
  }
  uVar14 = uVar16 - uVar2;
  uVar8 = (0xffffffffffffffffU >> (-(char)uVar2 & 0x3fU)) << (sbyte)uVar1;
  hpdata->active_pages[uVar3] = hpdata->active_pages[uVar3] | uVar8;
  lVar12 = uVar3 + 1;
  lVar6 = lVar12;
  uVar2 = uVar14;
  if (0x40 < uVar14) {
    uVar2 = 0x40;
    if (uVar11 < 0x40) {
      uVar2 = uVar11;
    }
    uVar9 = (uVar11 - uVar2) - 0x41;
    uVar5 = uVar9 >> 6;
    switchD_01043a80::default(hpdata->active_pages + uVar3 + 1,0xff,uVar5 * 8 + 8);
    uVar2 = (uVar11 - ((uVar9 & 0xffffffffffffffc0) + uVar2)) - 0x40;
    lVar6 = uVar5 + uVar3 + 2;
  }
  if (uVar2 != 0) {
    hpdata->active_pages[lVar6] =
         hpdata->active_pages[lVar6] | 0xffffffffffffffffU >> (-(char)uVar2 & 0x3fU);
  }
  hpdata->h_nactive = hpdata->h_nactive + uVar16;
  uVar2 = hpdata->touched_pages[uVar3];
  uVar5 = (uVar2 & uVar8) - ((uVar2 & uVar8) >> 1 & 0x5555555555555555);
  uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
  uVar10 = ((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38;
  uVar5 = uVar14;
  uVar9 = uVar3;
  if (uVar14 < 0x41) {
    lVar6 = lVar12;
    if (uVar14 == 0) {
      hpdata->touched_pages[uVar3] = uVar2 | uVar8;
      goto LAB_01c538ab;
    }
  }
  else {
    do {
      uVar13 = uVar9;
      uVar9 = hpdata->touched_pages[uVar13 + 1] -
              (hpdata->touched_pages[uVar13 + 1] >> 1 & 0x5555555555555555);
      uVar9 = (uVar9 >> 2 & 0x3333333333333333) + (uVar9 & 0x3333333333333333);
      uVar10 = uVar10 + (((uVar9 >> 4) + uVar9 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
      uVar5 = uVar5 - 0x40;
      uVar9 = uVar13 + 1;
    } while (0x40 < uVar5);
    lVar6 = uVar13 + 2;
  }
  uVar5 = (hpdata->touched_pages[lVar6] << (-(char)uVar5 & 0x3fU)) >> (-(char)uVar5 & 0x3fU);
  uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
  uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
  uVar10 = (((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) + uVar10;
  hpdata->touched_pages[uVar3] = uVar2 | uVar8;
  if (0x40 < uVar14) {
    uVar2 = 0x40;
    if (uVar11 < 0x40) {
      uVar2 = uVar11;
    }
    uVar14 = (uVar11 - uVar2) - 0x41;
    uVar8 = uVar14 >> 6;
    switchD_01043a80::default(hpdata->touched_pages + uVar3 + 1,0xff,uVar8 * 8 + 8);
    uVar14 = (uVar11 - ((uVar14 & 0xffffffffffffffc0) + uVar2)) - 0x40;
    lVar12 = uVar3 + uVar8 + 2;
  }
LAB_01c538ab:
  if (uVar14 != 0) {
    hpdata->touched_pages[lVar12] =
         hpdata->touched_pages[lVar12] | 0xffffffffffffffffU >> (-(char)uVar14 & 0x3fU);
  }
  hpdata->h_ntouched = hpdata->h_ntouched + (uVar16 - uVar10);
  if (uVar4 == hpdata->h_longest_free_range) {
    uVar16 = uVar16 + uVar7;
    uVar11 = uVar16;
    while (uVar2 = uVar15, uVar11 < 0x200) {
      uVar11 = uVar16 >> 6;
      uVar16 = (~hpdata->active_pages[uVar11] >> ((byte)uVar16 & 0x3f)) << ((byte)uVar16 & 0x3f);
      if (uVar16 == 0) {
        do {
          if (uVar11 == 7) goto LAB_01c539b2;
          lVar12 = uVar11 + 1;
          uVar11 = uVar11 + 1;
        } while (hpdata->active_pages[lVar12] == 0xffffffffffffffff);
        uVar16 = ~hpdata->active_pages[lVar12];
      }
      if (0x1ff < uVar11 << 6) break;
      uVar2 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      uVar8 = uVar11 << 6 | uVar2;
      uVar11 = uVar11 & 0x3ffffffffffffff;
      uVar3 = (hpdata->active_pages[uVar11] >> ((byte)uVar2 & 0x3f)) << ((byte)uVar2 & 0x3f);
      while (uVar2 = uVar4, uVar3 == 0) {
        if (uVar11 == 7) {
          uVar8 = 0x200 - uVar8;
          if ((uVar8 != uVar4) && (uVar2 = uVar15, uVar15 < uVar8)) {
            uVar2 = uVar8;
          }
          goto LAB_01c539b2;
        }
        lVar12 = uVar11 + 1;
        uVar11 = uVar11 + 1;
        uVar3 = hpdata->active_pages[lVar12];
      }
      uVar16 = 0;
      if (uVar3 != 0) {
        for (; (uVar3 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
        }
      }
      uVar11 = uVar11 << 6;
      uVar16 = uVar16 | uVar11;
      uVar8 = uVar16 - uVar8;
      if (uVar8 == uVar4) break;
      if (uVar15 < uVar8) {
        uVar15 = uVar8;
      }
    }
LAB_01c539b2:
    hpdata->h_longest_free_range = uVar2;
  }
  return (void *)(uVar7 * 0x1000 + (long)hpdata->h_address);
}

Assistant:

void *
hpdata_reserve_alloc(hpdata_t *hpdata, size_t sz) {
	hpdata_assert_consistent(hpdata);
	/*
	 * This is a metadata change; the hpdata should therefore either not be
	 * in the psset, or should have explicitly marked itself as being
	 * mid-update.
	 */
	assert(!hpdata->h_in_psset || hpdata->h_updating);
	assert(hpdata->h_alloc_allowed);
	assert((sz & PAGE_MASK) == 0);
	size_t npages = sz >> LG_PAGE;
	assert(npages <= hpdata_longest_free_range_get(hpdata));

	size_t result;

	size_t start = 0;
	/*
	 * These are dead stores, but the compiler will issue warnings on them
	 * since it can't tell statically that found is always true below.
	 */
	size_t begin = 0;
	size_t len = 0;

	size_t largest_unchosen_range = 0;
	while (true) {
		bool found = fb_urange_iter(hpdata->active_pages,
		    HUGEPAGE_PAGES, start, &begin, &len);
		/*
		 * A precondition to this function is that hpdata must be able
		 * to serve the allocation.
		 */
		assert(found);
		assert(len <= hpdata_longest_free_range_get(hpdata));
		if (len >= npages) {
			/*
			 * We use first-fit within the page slabs; this gives
			 * bounded worst-case fragmentation within a slab.  It's
			 * not necessarily right; we could experiment with
			 * various other options.
			 */
			break;
		}
		if (len > largest_unchosen_range) {
			largest_unchosen_range = len;
		}
		start = begin + len;
	}
	/* We found a range; remember it. */
	result = begin;
	fb_set_range(hpdata->active_pages, HUGEPAGE_PAGES, begin, npages);
	hpdata->h_nactive += npages;

	/*
	 * We might be about to dirty some memory for the first time; update our
	 * count if so.
	 */
	size_t new_dirty = fb_ucount(hpdata->touched_pages,  HUGEPAGE_PAGES,
	    result, npages);
	fb_set_range(hpdata->touched_pages, HUGEPAGE_PAGES, result, npages);
	hpdata->h_ntouched += new_dirty;

	/*
	 * If we allocated out of a range that was the longest in the hpdata, it
	 * might be the only one of that size and we'll have to adjust the
	 * metadata.
	 */
	if (len == hpdata_longest_free_range_get(hpdata)) {
		start = begin + npages;
		while (start < HUGEPAGE_PAGES) {
			bool found = fb_urange_iter(hpdata->active_pages,
			    HUGEPAGE_PAGES, start, &begin, &len);
			if (!found) {
				break;
			}
			assert(len <= hpdata_longest_free_range_get(hpdata));
			if (len == hpdata_longest_free_range_get(hpdata)) {
				largest_unchosen_range = len;
				break;
			}
			if (len > largest_unchosen_range) {
				largest_unchosen_range = len;
			}
			start = begin + len;
		}
		hpdata_longest_free_range_set(hpdata, largest_unchosen_range);
	}

	hpdata_assert_consistent(hpdata);
	return (void *)(
	    (byte_t *)hpdata_addr_get(hpdata) + (result << LG_PAGE));
}